

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

string * __thiscall
test_flash_attn_ext::vars_abi_cxx11_(string *__return_storage_ptr__,test_flash_attn_ext *this)

{
  char *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_5b8;
  string local_598;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_578;
  string local_558;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  string local_4f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4d8;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  string local_478;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_458;
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  string local_3f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3d8;
  string local_3b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_398;
  string local_378;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_358;
  string local_338;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_318;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  string local_38;
  
  var_to_str<long>(&local_38,&this->hsk);
  std::operator+(&local_2f8,"hsk=",&local_38);
  std::operator+(&local_2d8,&local_2f8,",");
  var_to_str<long>(&local_338,&this->hsv);
  std::operator+(&local_318,"hsv=",&local_338);
  std::operator+(&local_2b8,&local_2d8,&local_318);
  std::operator+(&local_298,&local_2b8,",");
  var_to_str<long>(&local_378,&this->nh);
  std::operator+(&local_358,"nh=",&local_378);
  std::operator+(&local_278,&local_298,&local_358);
  std::operator+(&local_258,&local_278,",");
  var_to_str<long>(&local_3b8,&this->nr);
  std::operator+(&local_398,"nr=",&local_3b8);
  std::operator+(&local_238,&local_258,&local_398);
  std::operator+(&local_218,&local_238,",");
  var_to_str<long>(&local_3f8,&this->kv);
  std::operator+(&local_3d8,"kv=",&local_3f8);
  std::operator+(&local_1f8,&local_218,&local_3d8);
  std::operator+(&local_1d8,&local_1f8,",");
  var_to_str<long>(&local_438,&this->nb);
  std::operator+(&local_418,"nb=",&local_438);
  std::operator+(&local_1b8,&local_1d8,&local_418);
  std::operator+(&local_198,&local_1b8,",");
  var_to_str<bool>(&local_478,&this->mask);
  std::operator+(&local_458,"mask=",&local_478);
  std::operator+(&local_178,&local_198,&local_458);
  std::operator+(&local_158,&local_178,",");
  var_to_str<float>(&local_4b8,&this->max_bias);
  std::operator+(&local_498,"max_bias=",&local_4b8);
  std::operator+(&local_138,&local_158,&local_498);
  std::operator+(&local_118,&local_138,",");
  var_to_str<float>(&local_4f8,&this->logit_softcap);
  std::operator+(&local_4d8,"logit_softcap=",&local_4f8);
  std::operator+(&local_f8,&local_118,&local_4d8);
  std::operator+(&local_d8,&local_f8,",");
  __s = "def";
  if (this->prec == GGML_PREC_F32) {
    __s = "f32";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_538,__s,(allocator<char> *)&bStack_5b8);
  std::operator+(&local_518,"prec=",&local_538);
  std::operator+(&local_b8,&local_d8,&local_518);
  std::operator+(&local_98,&local_b8,",");
  var_to_str_abi_cxx11_(&local_558,this->type_KV);
  std::operator+(&bStack_5b8,"type_KV=",&local_558);
  std::operator+(&local_78,&local_98,&bStack_5b8);
  std::operator+(&local_58,&local_78,",");
  var_to_str<int,4ul>(&local_598,&this->permute);
  std::operator+(&local_578,"permute=",&local_598);
  std::operator+(__return_storage_ptr__,&local_58,&local_578);
  std::__cxx11::string::~string((string *)&local_578);
  std::__cxx11::string::~string((string *)&local_598);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_5b8);
  std::__cxx11::string::~string((string *)&local_558);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::~string((string *)&local_b8);
  std::__cxx11::string::~string((string *)&local_518);
  std::__cxx11::string::~string((string *)&local_538);
  std::__cxx11::string::~string((string *)&local_d8);
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_4d8);
  std::__cxx11::string::~string((string *)&local_4f8);
  std::__cxx11::string::~string((string *)&local_118);
  std::__cxx11::string::~string((string *)&local_138);
  std::__cxx11::string::~string((string *)&local_498);
  std::__cxx11::string::~string((string *)&local_4b8);
  std::__cxx11::string::~string((string *)&local_158);
  std::__cxx11::string::~string((string *)&local_178);
  std::__cxx11::string::~string((string *)&local_458);
  std::__cxx11::string::~string((string *)&local_478);
  std::__cxx11::string::~string((string *)&local_198);
  std::__cxx11::string::~string((string *)&local_1b8);
  std::__cxx11::string::~string((string *)&local_418);
  std::__cxx11::string::~string((string *)&local_438);
  std::__cxx11::string::~string((string *)&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&local_3d8);
  std::__cxx11::string::~string((string *)&local_3f8);
  std::__cxx11::string::~string((string *)&local_218);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_398);
  std::__cxx11::string::~string((string *)&local_3b8);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&local_378);
  std::__cxx11::string::~string((string *)&local_298);
  std::__cxx11::string::~string((string *)&local_2b8);
  std::__cxx11::string::~string((string *)&local_318);
  std::__cxx11::string::~string((string *)&local_338);
  std::__cxx11::string::~string((string *)&local_2d8);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string vars() override {
        return VARS_TO_STR12(hsk, hsv, nh, nr, kv, nb, mask, max_bias, logit_softcap, prec, type_KV, permute);
    }